

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

char * nk_dtoa(char *s,double n)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  int j;
  int i;
  double t;
  double weight;
  int neg;
  char *c;
  int m1;
  int m;
  int digit;
  int useExp;
  int local_50;
  int local_4c;
  char *local_30;
  int local_28;
  int local_24;
  double local_18;
  char *local_8;
  
  local_28 = 0;
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = in_RDI;
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      bVar2 = in_XMM0_Qa < 0.0;
      local_18 = in_XMM0_Qa;
      if (bVar2) {
        local_18 = -in_XMM0_Qa;
      }
      local_24 = nk_log10(local_18);
      bVar1 = true;
      if ((local_24 < 0xe) && ((!bVar2 || (bVar1 = true, local_24 < 9)))) {
        bVar1 = local_24 < -8;
      }
      local_30 = in_RDI;
      if (bVar2) {
        local_30 = in_RDI + 1;
        *in_RDI = '-';
      }
      if (bVar1) {
        if (local_24 < 0) {
          local_24 = local_24 + -1;
        }
        dVar4 = nk_pow(10.0,local_24);
        local_18 = local_18 / dVar4;
        local_28 = local_24;
        local_24 = 0;
      }
      if ((double)local_24 < 1.0) {
        local_24 = 0;
      }
      for (; 1e-14 < local_18 || -1 < local_24; local_24 = local_24 + -1) {
        dVar4 = nk_pow(10.0,local_24);
        if (0.0 < dVar4) {
          iVar3 = nk_ifloord(local_18 / dVar4);
          local_18 = -(double)iVar3 * dVar4 + local_18;
          *local_30 = (char)iVar3 + '0';
          local_30 = local_30 + 1;
        }
        if ((local_24 == 0) && (0.0 < local_18)) {
          *local_30 = '.';
          local_30 = local_30 + 1;
        }
      }
      if (bVar1) {
        *local_30 = 'e';
        if (local_28 < 1) {
          local_30[1] = '-';
          local_28 = -local_28;
        }
        else {
          local_30[1] = '+';
        }
        local_30 = local_30 + 2;
        local_24 = 0;
        for (; 0 < local_28; local_28 = local_28 / 10) {
          *local_30 = (char)(local_28 % 10) + '0';
          local_24 = local_24 + 1;
          local_30 = local_30 + 1;
        }
        local_50 = local_24;
        for (local_4c = 0; local_50 = local_50 + -1, local_4c < local_50; local_4c = local_4c + 1) {
          local_30[(long)local_4c - (long)local_24] =
               local_30[(long)local_4c - (long)local_24] ^ local_30[(long)local_50 - (long)local_24]
          ;
          local_30[(long)local_50 - (long)local_24] =
               local_30[(long)local_50 - (long)local_24] ^ local_30[(long)local_4c - (long)local_24]
          ;
          local_30[(long)local_4c - (long)local_24] =
               local_30[(long)local_4c - (long)local_24] ^ local_30[(long)local_50 - (long)local_24]
          ;
        }
        local_30 = local_30 + ((long)local_24 - (long)local_24);
      }
      *local_30 = '\0';
    }
    else {
      *in_RDI = '0';
      in_RDI[1] = '\0';
    }
  }
  return local_8;
}

Assistant:

NK_LIB char*
nk_dtoa(char *s, double n)
{
int useExp = 0;
int digit = 0, m = 0, m1 = 0;
char *c = s;
int neg = 0;

NK_ASSERT(s);
if (!s) return 0;

if (n == 0.0) {
s[0] = '0'; s[1] = '\0';
return s;
}

neg = (n < 0);
if (neg) n = -n;

/* calculate magnitude */
m = nk_log10(n);
useExp = (m >= 14 || (neg && m >= 9) || m <= -9);
if (neg) *(c++) = '-';

/* set up for scientific notation */
if (useExp) {
if (m < 0)
m -= 1;
n = n / (double)nk_pow(10.0, m);
m1 = m;
m = 0;
}
if (m < 1.0) {
m = 0;
}

/* convert the number */
while (n > NK_FLOAT_PRECISION || m >= 0) {
double weight = nk_pow(10.0, m);
if (weight > 0) {
double t = (double)n / weight;
digit = nk_ifloord(t);
n -= ((double)digit * weight);
*(c++) = (char)('0' + (char)digit);
}
if (m == 0 && n > 0)
*(c++) = '.';
m--;
}

if (useExp) {
/* convert the exponent */
int i, j;
*(c++) = 'e';
if (m1 > 0) {
*(c++) = '+';
} else {
*(c++) = '-';
m1 = -m1;
}
m = 0;
while (m1 > 0) {
*(c++) = (char)('0' + (char)(m1 % 10));
m1 /= 10;
m++;
}
c -= m;
for (i = 0, j = m-1; i<j; i++, j--) {
/* swap without temporary */
c[i] ^= c[j];
c[j] ^= c[i];
c[i] ^= c[j];
}
c += m;
}
*(c) = '\0';
return s;
}